

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

double __thiscall imrt::Station::intensityUp(Station *this,int i,int j)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  pointer ppVar6;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  iterator it;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff88;
  _Rb_tree_iterator<std::pair<const_int,_int>_> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  _Self local_40;
  _Base_ptr local_38;
  int local_2c;
  _Self local_28;
  _Base_ptr local_20;
  int local_18;
  int local_14;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  pdVar5 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),in_ESI,in_EDX);
  if ((*pdVar5 == -1.0) && (!NAN(*pdVar5))) {
    pdVar5 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_14,local_18);
    return *pdVar5;
  }
  iVar3 = getMaxIntensityRow((Station *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                             (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  pdVar5 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_14,local_18);
  if (*pdVar5 < (double)iVar3) {
    if (-1 < local_18 + -1) {
      pdVar5 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_14,local_18 + -1);
      dVar1 = *pdVar5;
      pdVar5 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_14,local_18);
      if (*pdVar5 <= dVar1 && dVar1 != *pdVar5) goto LAB_00135ac0;
    }
    iVar3 = local_18 + 1;
    iVar4 = maths::Matrix::nb_cols((Matrix *)(in_RDI + 0xb8));
    if (iVar4 <= iVar3) goto LAB_00135bb0;
    pdVar5 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_14,local_18 + 1);
    in_stack_ffffffffffffff98 = (_Rb_tree_iterator<std::pair<const_int,_int>_> *)*pdVar5;
    pdVar5 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_14,local_18);
    if ((double)in_stack_ffffffffffffff98 < *pdVar5 || (double)in_stack_ffffffffffffff98 == *pdVar5)
    goto LAB_00135bb0;
  }
LAB_00135ac0:
  pdVar5 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_14,local_18);
  if ((*pdVar5 == 0.0) && (!NAN(*pdVar5))) {
    local_20 = (_Base_ptr)
               std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               begin(in_stack_ffffffffffffff88);
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)0x135b08);
    return (double)ppVar6->first;
  }
  iVar3 = (int)((ulong)(in_RDI + 0x140) >> 0x20);
  pdVar5 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_14,local_18);
  local_2c = (int)*pdVar5;
  local_28._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                 (in_stack_ffffffffffffff88,(key_type_conflict *)0x135b55);
  local_38 = (_Base_ptr)
             std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++
                       (in_stack_ffffffffffffff98,iVar3);
  local_40._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                 (in_stack_ffffffffffffff88);
  bVar2 = std::operator!=(&local_28,&local_40);
  if (bVar2) {
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)0x135ba0);
    return (double)ppVar6->first;
  }
LAB_00135bb0:
  pdVar5 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_14,local_18);
  return *pdVar5;
}

Assistant:

double Station::intensityUp(int i, int j){
    if(I(i,j)==-1) return I(i,j);
    if(getMaxIntensityRow(i) <= I(i,j) ||
        (j-1>=0 && I(i,j-1)>I(i,j)) || (j+1<I.nb_cols() && I(i,j+1)>I(i,j)) ){
            //next available intensity
            if(I(i,j)==0) return int2nb.begin()->first;
            else{
              map< int, int >::iterator it = int2nb.find(I(i,j)); it++;
              if(it!=int2nb.end())
                return it->first;
            }
     }
    return I(i,j);
  }